

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool tinyusdz::GeomSubset::ValidateSubsets
               (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                *subsets,size_t elementCount,FamilyType *familyType,string *err)

{
  storage_t<tinyusdz::GeomSubset::ElementType> sVar1;
  pointer ppGVar2;
  GeomSubset *pGVar3;
  undefined4 *puVar4;
  string *psVar5;
  bool bVar6;
  long lVar7;
  _Base_ptr args;
  ElementType v;
  ElementType v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pointer ppGVar8;
  undefined4 *puVar9;
  bool bVar10;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar11;
  size_t maxIndex;
  Animatable<std::vector<int,_std::allocator<int>_>_> indices;
  int32_t index;
  int minIndex;
  set<int,_std::less<int>,_std::allocator<int>_> indicesInFamily;
  stringstream ss;
  string local_2b8;
  string local_298;
  uint local_274;
  undefined1 local_270 [8];
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_258;
  undefined1 local_248 [44];
  undefined1 local_21c [12];
  undefined4 *puStack_210;
  undefined8 local_208;
  string *local_200;
  pointer local_1f8;
  pointer local_1f0;
  undefined1 local_1e8 [32];
  _Base_ptr local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  ppGVar8 = (subsets->
            super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (subsets->
            super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar8 == ppGVar2) {
    return true;
  }
  sVar1 = (&((*ppGVar8)->elementType)._attrib)[((*ppGVar8)->elementType)._attrib.has_value_ ^ 1].
          contained;
  do {
    ppGVar8 = ppGVar8 + 1;
    bVar10 = ppGVar8 == ppGVar2;
    local_274 = (uint)bVar10;
    local_270 = (undefined1  [8])elementCount;
    if (bVar10) {
      args = (_Base_ptr)(local_1e8 + 8);
      local_1e8._8_4_ = _S_red;
      local_1e8._16_8_ = (_Link_type)0x0;
      local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_200 = err;
      local_1e8._24_8_ = args;
      local_1c8 = args;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      ppGVar8 = (subsets->
                super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_1f8 = (subsets->
                  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if (ppGVar8 == local_1f8) {
        bVar10 = true;
      }
      else {
        bVar10 = true;
        do {
          pGVar3 = *ppGVar8;
          local_248[0x10] = 0;
          local_248._17_8_ = 0;
          local_248._0_8_ = (pointer)0x0;
          local_248[8] = 0;
          local_248._9_7_ = 0;
          aStack_258._M_allocated_capacity._0_2_ = 0;
          aStack_258._M_allocated_capacity._2_6_ = 0;
          aStack_258._M_local_buf[8] = '\0';
          aStack_258._M_local_buf[9] = '\0';
          local_268._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_268._8_2_ = 0;
          local_268._10_6_ = 0;
          bVar6 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
                  get_value(&pGVar3->indices,
                            (Animatable<std::vector<int,_std::allocator<int>_>_> *)local_268);
          if (!bVar6) {
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,
                       "GeomSubset {}\'s indices is not value Attribute. Connection or ValueBlock?\n"
                       ,"");
            fmt::format<std::__cxx11::string>
                      ((string *)&local_2b8,(fmt *)&local_298,(string *)&pGVar3->name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = false;
          }
          if (aStack_258._M_local_buf[9] == '\x01') {
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,"GeomSubset {}\'s indices is Value Blocked.\n","");
            fmt::format<std::__cxx11::string>
                      ((string *)&local_2b8,(fmt *)&local_298,(string *)&pGVar3->name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = false;
          }
          if ((((aStack_258._M_local_buf[9] == '\0') && (aStack_258._M_local_buf[8] == '\0')) &&
              ((pointer)local_248._0_8_ != (pointer)CONCAT71(local_248._9_7_,local_248[8]))) ||
             (aStack_258._M_local_buf[8] == '\0')) {
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,
                       "ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n","")
            ;
            fmt::format(&local_2b8,&local_298);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = false;
          }
          local_21c._4_8_ = (undefined4 *)0x0;
          puStack_210 = (undefined4 *)0x0;
          local_208 = 0;
          local_1f0 = ppGVar8;
          if ((aStack_258._M_local_buf[9] == '\0') && (aStack_258._M_local_buf[8] == '\x01')) {
            ::std::vector<int,_std::allocator<int>_>::operator=
                      ((vector<int,_std::allocator<int>_> *)(local_21c + 4),
                       (vector<int,_std::allocator<int>_> *)local_268);
          }
          else {
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,
                       "ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n","");
            fmt::format(&local_2b8,&local_298);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = false;
          }
          puVar4 = puStack_210;
          if ((undefined4 *)local_21c._4_8_ != puStack_210) {
            puVar9 = (undefined4 *)local_21c._4_8_;
            do {
              local_21c._0_4_ = *puVar9;
              pVar11 = ::std::
                       _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                       _M_insert_unique<int_const&>
                                 ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                   *)local_1e8,(int *)local_21c);
              if ((((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (*familyType != Unrestricted)) {
                local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_298,"Found overlapping index {} in GeomSubset `{}`\n",""
                          );
                args = (_Base_ptr)&pGVar3->name;
                fmt::format<int,std::__cxx11::string>
                          (&local_2b8,(fmt *)&local_298,(string *)local_21c,(int *)&pGVar3->name,
                           in_R8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                           local_2b8._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                  operator_delete(local_2b8._M_dataplus._M_p,
                                  local_2b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  local_298.field_2._M_allocated_capacity + 1);
                }
                bVar10 = false;
              }
              puVar9 = puVar9 + 1;
            } while (puVar9 != puVar4);
          }
          if ((undefined4 *)local_21c._4_8_ != (undefined4 *)0x0) {
            operator_delete((void *)local_21c._4_8_,local_208 - local_21c._4_8_);
          }
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                     *)local_248);
          ppGVar8 = local_1f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_268._0_8_,
                            CONCAT62(aStack_258._M_allocated_capacity._2_6_,
                                     aStack_258._M_allocated_capacity._0_2_) - local_268._0_8_);
          }
          ppGVar8 = ppGVar8 + 1;
        } while (ppGVar8 != local_1f8);
      }
      if ((*familyType == Partition) && ((undefined1  [8])local_1c0 != local_270)) {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,
                   "ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n"
                   ,"");
        local_298._M_dataplus._M_p = (pointer)local_1c0;
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)local_268,(fmt *)&local_2b8,&local_298,(unsigned_long *)local_270,
                   (unsigned_long *)in_R8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)local_268._0_8_,
                   CONCAT62(local_268._10_6_,local_268._8_2_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._0_8_ != &aStack_258) {
          operator_delete((void *)local_268._0_8_,
                          CONCAT62(aStack_258._M_allocated_capacity._2_6_,
                                   aStack_258._M_allocated_capacity._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        bVar10 = false;
      }
      lVar7 = ::std::_Rb_tree_decrement((_Rb_tree_node_base *)(local_1e8 + 8));
      local_298._M_dataplus._M_p = (pointer)(long)*(int *)(lVar7 + 0x20);
      local_21c._4_4_ =
           *(undefined4 *)
            &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1e8._24_8_ + 0x20))->_M_dataplus)._M_p;
      if ((ulong)local_270 <= local_298._M_dataplus._M_p) {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,
                   "ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n"
                   ,"");
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)local_268,(fmt *)&local_2b8,(string *)local_270,
                   (unsigned_long *)&local_298,(unsigned_long *)in_R8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)local_268._0_8_,
                   CONCAT62(local_268._10_6_,local_268._8_2_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._0_8_ != &aStack_258) {
          operator_delete((void *)local_268._0_8_,
                          CONCAT62(aStack_258._M_allocated_capacity._2_6_,
                                   aStack_258._M_allocated_capacity._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        bVar10 = false;
      }
      if ((int)local_21c._4_4_ < 0) {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,
                   "ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n"
                   ,"");
        fmt::format<int>((string *)local_268,&local_2b8,(int *)(local_21c + 4));
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)local_268._0_8_,
                   CONCAT62(local_268._10_6_,local_268._8_2_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._0_8_ != &aStack_258) {
          operator_delete((void *)local_268._0_8_,
                          CONCAT62(aStack_258._M_allocated_capacity._2_6_,
                                   aStack_258._M_allocated_capacity._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        bVar10 = false;
      }
      psVar5 = local_200;
      if ((local_200 != (string *)0x0) && (!bVar10)) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)psVar5,local_268._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._0_8_ != &aStack_258) {
          operator_delete((void *)local_268._0_8_,
                          CONCAT62(aStack_258._M_allocated_capacity._2_6_,
                                   aStack_258._M_allocated_capacity._0_2_) + 1);
        }
      }
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      ::std::ios_base::~ios_base(local_138);
      ::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_1e8,(_Link_type)local_1e8._16_8_);
      goto LAB_0048ddc4;
    }
    pGVar3 = *ppGVar8;
  } while ((&(pGVar3->elementType)._attrib)[(pGVar3->elementType)._attrib.has_value_ ^ 1].contained
           == sVar1);
  if (err == (string *)0x0) {
    return bVar10;
  }
  local_268._0_8_ = &aStack_258;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,"GeomSubset {}\'s elementType must be `{}`, but got `{}`.\n","");
  tinyusdz::to_string_abi_cxx11_((string *)local_1e8,(tinyusdz *)(ulong)(uint)sVar1,v);
  tinyusdz::to_string_abi_cxx11_
            (&local_2b8,
             (tinyusdz *)
             (ulong)(uint)(&(pGVar3->elementType)._attrib)
                          [(pGVar3->elementType)._attrib.has_value_ ^ 1].contained,v_00);
  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((string *)local_1b8,(fmt *)local_268,&pGVar3->name,(string *)local_1e8,&local_2b8,in_R9
            );
  ::std::__cxx11::string::operator=((string *)err,(string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._0_8_ != &aStack_258) {
    operator_delete((void *)local_268._0_8_,
                    CONCAT62(aStack_258._M_allocated_capacity._2_6_,
                             aStack_258._M_allocated_capacity._0_2_) + 1);
  }
LAB_0048ddc4:
  return (bool)(undefined1)local_274;
}

Assistant:

bool GeomSubset::ValidateSubsets(
    const std::vector<const GeomSubset *> &subsets,
    const size_t elementCount,
    const FamilyType &familyType, std::string *err) {

  if (subsets.empty()) {
    return true;
  }

  // All subsets must have the same elementType.
  GeomSubset::ElementType elementType = subsets[0]->elementType.get_value();
  for (const auto psubset : subsets) {
    if (psubset->elementType.get_value() != elementType) {
      if (err) {
        (*err) = fmt::format("GeomSubset {}'s elementType must be `{}`, but got `{}`.\n",
          psubset->name, to_string(elementType), to_string(psubset->elementType.get_value()));
      }

      return false;
    }
  }

  std::set<int32_t> indicesInFamily;

  bool valid = true;
  std::stringstream ss;

  // TODO: TimeSampled indices
  for (const auto psubset : subsets) {
    Animatable<std::vector<int32_t>> indices;
    if (!psubset->indices.get_value(&indices)) {
      ss << fmt::format("GeomSubset {}'s indices is not value Attribute. Connection or ValueBlock?\n",
          psubset->name);

      valid = false;
    }

    if (indices.is_blocked()) {
      ss << fmt::format("GeomSubset {}'s indices is Value Blocked.\n", psubset->name);
      valid = false;
    }

    if (indices.is_timesamples() || !indices.has_value()) {
      ss << fmt::format("ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n");
      valid = false;
    }

    std::vector<int32_t> subsetIndices;
    if (!indices.get_scalar(&subsetIndices)) {
      ss << fmt::format("ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n");
      valid = false;
    }

    for (const int32_t index : subsetIndices) {
      if (!indicesInFamily.insert(index).second && (familyType != FamilyType::Unrestricted)) {
        ss << fmt::format("Found overlapping index {} in GeomSubset `{}`\n", index, psubset->name);
        valid = false;
      }
    }
  }


  // Make sure every index appears exactly once if it's a partition.
  if ((familyType == FamilyType::Partition) && (indicesInFamily.size() != elementCount)) {
    ss << fmt::format("ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n", indicesInFamily.size(), elementCount);
    valid = false;
  }

  // Ensure that the indices are in the range [0, faceCount)
  size_t maxIndex = static_cast<size_t>(*indicesInFamily.rbegin());
  int minIndex = *indicesInFamily.begin();

  if (maxIndex >= elementCount) {
    ss << fmt::format("ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n", elementCount, maxIndex);

    valid = false;
  }

  if (minIndex < 0) {
    ss << fmt::format("ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n", minIndex);

    valid = false;
  }

  if (!valid) {
    if (err) {
      (*err) += ss.str();
    }
  }

  return true;

}